

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norm2allmodes.h
# Opt level: O1

uint8_t __thiscall
icu_63::Normalizer2WithImpl::getCombiningClass(Normalizer2WithImpl *this,UChar32 c)

{
  Normalizer2Impl *this_00;
  uint16_t uVar1;
  uint8_t uVar2;
  
  this_00 = this->impl;
  uVar1 = Normalizer2Impl::getNorm16(this_00,c);
  if (uVar1 < 0xfc00) {
    uVar2 = '\0';
    if ((this_00->minNoNo <= uVar1) && (uVar1 < this_00->limitNoNo)) {
      if ((*(byte *)((long)this_00->extraData + (ulong)(uVar1 & 0xfffe)) & 0x80) == 0) {
        uVar2 = '\0';
      }
      else {
        uVar2 = (uint8_t)this_00->extraData[(ulong)(uVar1 >> 1) - 1];
      }
    }
  }
  else {
    uVar2 = (uint8_t)(uVar1 >> 1);
  }
  return uVar2;
}

Assistant:

virtual uint8_t
    getCombiningClass(UChar32 c) const {
        return impl.getCC(impl.getNorm16(c));
    }